

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O2

void __thiscall
agge::tests::RendererTests::RendererPopulatesBitmapWithMaskDataAccordinglyToOffsetAndWindow
          (RendererTests *this)

{
  allocator local_1c9;
  uint8_t reference1 [42];
  renderer r;
  bitmap<unsigned_char,_1UL,_0UL> bitmap;
  blender<unsigned_char,_unsigned_char> blender;
  string local_148;
  LocationInfo local_128;
  mask_full<8UL> mask;
  cell cells14 [2];
  undefined1 local_c0 [8];
  cell cells13 [2];
  undefined1 local_a0 [8];
  cell cells12 [2];
  undefined1 local_80 [8];
  cell cells11 [2];
  undefined1 local_60 [8];
  rect_i window1;
  scanline_cells cells1 [4];
  
  cells1[0].second = (cell *)local_60;
  cells11[0].x = 0;
  cells11[0].area = 0;
  cells11[0].cover = 0x11;
  cells11[1].x = 4;
  cells11[1].area = 0;
  cells11[1].cover = -0x11;
  cells1[1].second = (cell *)local_80;
  cells12[0].x = 1;
  cells12[0].area = 0;
  cells12[0].cover = 0xab;
  cells12[1].x = 5;
  cells12[1].area = 0;
  cells12[1].cover = -0xab;
  cells1[2].second = (cell *)local_a0;
  cells13[0].x = 2;
  cells13[0].area = 0;
  cells13[0].cover = 0xa0;
  cells13[1].x = 6;
  cells13[1].area = 0;
  cells13[1].cover = -0xa0;
  cells1[3].second = (cell *)local_c0;
  cells14[0].x = 3;
  cells14[0].area = 0;
  cells14[0].cover = 0xc0;
  cells14[1].x = 7;
  cells14[1].area = 0;
  cells14[1].cover = -0xc0;
  cells1[0].first = cells11;
  cells1[1].first = cells12;
  cells1[2].first = cells13;
  cells1[3].first = cells14;
  mocks::mask<8ul>::
  mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,4>
            ((mask<8ul> *)&mask,&cells1,0);
  mocks::bitmap<unsigned_char,_1UL,_0UL>::bitmap(&bitmap,6,6);
  blender.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  r._scanline_cache._buffer = (uint8_t *)0x0;
  r._scanline_cache._size = 0;
  blender.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  blender.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  window1.x1 = 2;
  window1.y1 = 1;
  window1.x2 = 5;
  window1.y2 = 3;
  renderer::operator()
            (&r,&bitmap,(vector_i)0x100000001,&window1,&mask,&blender,
             (simple_alpha<unsigned_char,_8UL> *)reference1);
  reference1[0x20] = '\0';
  reference1[0x21] = '\0';
  reference1[0x22] = '\0';
  reference1[0x23] = '\0';
  reference1[0x24] = '\0';
  reference1[0x25] = '\0';
  reference1[0x26] = '\0';
  reference1[0x27] = '\0';
  reference1[0x28] = '\0';
  reference1[0x29] = '\0';
  reference1[0x10] = '\0';
  reference1[0x11] = '\0';
  reference1[0x12] = '\0';
  reference1[0x13] = '\0';
  reference1[0x14] = '\0';
  reference1[0x15] = '\0';
  reference1[0x16] = '\0';
  reference1[0x17] = '\0';
  reference1[0x18] = '\0';
  reference1[0x19] = '\0';
  reference1[0x1a] = '\0';
  reference1[0x1b] = '\0';
  reference1[0x1c] = '\0';
  reference1[0x1d] = '\0';
  reference1[0x1e] = '\0';
  reference1[0x1f] = '\0';
  reference1[0] = '\0';
  reference1[1] = 0xab;
  reference1[2] = 0xab;
  reference1[3] = 0xab;
  reference1[4] = '\0';
  reference1[5] = '\0';
  reference1[6] = '\0';
  reference1[7] = '\0';
  reference1[8] = 0xa0;
  reference1[9] = 0xa0;
  reference1[10] = 0xa0;
  reference1[0xb] = '\0';
  reference1[0xc] = '\0';
  reference1[0xd] = '\0';
  reference1[0xe] = '\0';
  reference1[0xf] = '\0';
  std::__cxx11::string::string
            ((string *)&local_148,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_1c9);
  ut::LocationInfo::LocationInfo(&local_128,&local_148,0x4b2);
  ut::are_equal<unsigned_char,42ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&reference1,&bitmap.data,&local_128);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  raw_memory_object::~raw_memory_object(&r._scanline_cache);
  std::
  _Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ::~_Vector_base((_Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                   *)&blender);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bitmap);
  std::
  _Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
  ::~_Vector_base(&mask.super_mask<8UL>._cells.
                   super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
                 );
  return;
}

Assistant:

test( RendererPopulatesBitmapWithMaskDataAccordinglyToOffsetAndWindow )
			{
				// INIT
				const mocks::cell cells11[] = { { 0, 0, 0x11 }, { 4, 0, -0x11 }, };
				const mocks::cell cells12[] = { { 1, 0, 0xAB }, { 5, 0, -0xAB }, };
				const mocks::cell cells13[] = { { 2, 0, 0xA0 }, { 6, 0, -0xA0 }, };
				const mocks::cell cells14[] = { { 3, 0, 0xC0 }, { 7, 0, -0xC0 }, };
				const mocks::mask<8>::scanline_cells cells1[] = {
					make_pair(begin(cells11), end(cells11)),
					make_pair(begin(cells12), end(cells12)),
					make_pair(begin(cells13), end(cells13)),
					make_pair(begin(cells14), end(cells14)),
				};
				const mocks::mask_full<8> mask(cells1, 0);
				mocks::bitmap<uint8_t, 1> bitmap(6, 6);
				mocks::blender<uint8_t, uint8_t> blender;
				renderer r;

				// ACT
				rect_i window1 = { 2, 1, 5, 3 };
				r(bitmap, mkvector(1, 1), &window1, mask, blender, mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				uint8_t reference1[] = {
					0x00, 0xAB, 0xAB, 0xAB, 0x00, 0x00, 0x00,
					0x00, 0xA0, 0xA0, 0xA0, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
				};

				assert_equal(reference1, bitmap.data);
			}